

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# userop.cc
# Opt level: O1

UserPcodeOp * __thiscall UserOpManage::getOp(UserOpManage *this,string *nm)

{
  const_iterator cVar1;
  UserPcodeOp *pUVar2;
  
  cVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UserPcodeOp_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UserPcodeOp_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UserPcodeOp_*>_>_>
          ::find(&(this->useropmap)._M_t,nm);
  if ((_Rb_tree_header *)cVar1._M_node == &(this->useropmap)._M_t._M_impl.super__Rb_tree_header) {
    pUVar2 = (UserPcodeOp *)0x0;
  }
  else {
    pUVar2 = *(UserPcodeOp **)(cVar1._M_node + 2);
  }
  return pUVar2;
}

Assistant:

UserPcodeOp *UserOpManage::getOp(const string &nm) const

{
  map<string,UserPcodeOp *>::const_iterator iter;
  iter = useropmap.find(nm);
  if (iter == useropmap.end()) return (UserPcodeOp *)0;
  return (*iter).second;
}